

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

cgltf_component_type cgltf_json_to_component_type(jsmntok_t *tok,uint8_t *json_chunk)

{
  int iVar1;
  cgltf_component_type cVar2;
  
  iVar1 = cgltf_json_to_int(tok,json_chunk);
  cVar2 = cgltf_component_type_invalid;
  if (iVar1 - 0x1400U < 7) {
    cVar2 = *(cgltf_component_type *)(&DAT_0017c080 + (ulong)(iVar1 - 0x1400U) * 4);
  }
  return cVar2;
}

Assistant:

static cgltf_component_type cgltf_json_to_component_type(jsmntok_t const* tok, const uint8_t* json_chunk)
{
    int type = cgltf_json_to_int(tok, json_chunk);

    switch (type)
    {
        case 5120:
            return cgltf_component_type_r_8;
        case 5121:
            return cgltf_component_type_r_8u;
        case 5122:
            return cgltf_component_type_r_16;
        case 5123:
            return cgltf_component_type_r_16u;
        case 5125:
            return cgltf_component_type_r_32u;
        case 5126:
            return cgltf_component_type_r_32f;
        default:
            return cgltf_component_type_invalid;
    }
}